

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hh
# Opt level: O3

void __thiscall SatLookAngles::updateTimeAndPositions(SatLookAngles *this)

{
  pointer ppVar1;
  long lVar2;
  CoordTopocentric *pCVar3;
  pointer ppVar4;
  Eci pos;
  SGP4 model;
  CoordTopocentric local_368;
  Eci local_348;
  SGP4 local_300;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  (this->_time).m_encoded = lVar2 / 1000 + 0xdcbffeff2bc000;
  ppVar4 = (this->_sats).
           super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->_sats).
           super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    pCVar3 = &ppVar4->second;
    do {
      OrbitalElements::OrbitalElements(&local_300.elements_,(Tle *)&pCVar3[-7].elevation);
      SGP4::Initialise(&local_300);
      SGP4::FindPosition(&local_348,&local_300,&this->_time);
      Observer::GetLookAngle(&local_368,&this->_me,&local_348);
      if (pCVar3 != &local_368) {
        pCVar3->azimuth = local_368.azimuth;
        pCVar3->elevation = local_368.elevation;
        pCVar3->range = local_368.range;
        pCVar3->range_rate = local_368.range_rate;
      }
      ppVar4 = (pointer)(pCVar3 + 1);
      pCVar3 = (CoordTopocentric *)&pCVar3[7].range_rate;
    } while (ppVar4 != ppVar1);
  }
  return;
}

Assistant:

void updateTimeAndPositions() {
    _time = DateTime::Now(true);
    for (auto &sat : _sats) {
      const auto model = SGP4(sat.first);
      const auto pos = model.FindPosition(_time);
      sat.second = _me.GetLookAngle(pos);
    }
  }